

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O3

void __thiscall
helix::nasdaq::nordic_itch_handler::process_msg
          (nordic_itch_handler *this,itch_order_executed_with_price *m)

{
  order_book *this_00;
  iterator iVar1;
  undefined8 uVar2;
  long lVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t quantity;
  uint64_t order_id;
  execution result;
  trade t;
  uint64_t local_b0;
  event local_a8;
  execution local_68;
  trade local_50;
  
  lVar3 = 1;
  local_b0 = 0;
  while (m->OrderReferenceNumber[lVar3 + -1] == ' ') {
    lVar3 = lVar3 + 1;
    if (lVar3 == 10) goto LAB_00118d98;
  }
  local_b0 = 0;
  for (; lVar3 != 10; lVar3 = lVar3 + 1) {
    local_b0 = ((long)m->OrderReferenceNumber[lVar3 + -1] + local_b0 * 10) - 0x30;
  }
LAB_00118d98:
  iVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_helix::order_book_&>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->order_id_map)._M_h,&local_b0);
  if (iVar1.super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book_&>,_false>.
      _M_cur == (__node_type *)0x0) {
    return;
  }
  quantity = 0;
  lVar3 = 0;
  while (m->ExecutedQuantity[lVar3] == ' ') {
    lVar3 = lVar3 + 1;
    if (lVar3 == 9) goto LAB_00118dcc;
  }
  quantity = 0;
  for (; lVar3 != 9; lVar3 = lVar3 + 1) {
    quantity = ((long)m->ExecutedQuantity[lVar3] + quantity * 10) - 0x30;
  }
LAB_00118dcc:
  uVar5 = 0;
  lVar3 = 0;
  while (m->TradePrice[lVar3] == ' ') {
    lVar3 = lVar3 + 1;
    if (lVar3 == 10) goto LAB_00118de6;
  }
  uVar5 = 0;
  for (; lVar3 != 10; lVar3 = lVar3 + 1) {
    uVar5 = ((long)m->TradePrice[lVar3] + uVar5 * 10) - 0x30;
  }
LAB_00118de6:
  this_00 = *(order_book **)
             ((long)iVar1.
                    super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book_&>,_false>
                    ._M_cur + 0x10);
  order_book::execute(&local_68,this_00,local_b0,quantity);
  uVar4 = this->time_sec * 1000 + this->time_msec;
  this_00->_timestamp = uVar4;
  local_50.sign = itch_trade_sign(local_68.side);
  local_50.timestamp = uVar4;
  local_50.price = uVar5;
  local_50.size = quantity;
  make_event(&local_a8,&this_00->_symbol,this->time_sec * 1000 + this->time_msec,this_00,&local_50,
             (uint)(local_68.remaining == 0) << 2);
  if ((this->_process_event).super__Function_base._M_manager == (_Manager_type)0x0) {
    uVar2 = std::__throw_bad_function_call();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._symbol._M_dataplus._M_p != &local_a8._symbol.field_2) {
      operator_delete(local_a8._symbol._M_dataplus._M_p,
                      local_a8._symbol.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(uVar2);
  }
  (*(this->_process_event)._M_invoker)((_Any_data *)&this->_process_event,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._symbol._M_dataplus._M_p == &local_a8._symbol.field_2) {
    return;
  }
  operator_delete(local_a8._symbol._M_dataplus._M_p,
                  local_a8._symbol.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void nordic_itch_handler::process_msg(const itch_order_executed_with_price* m)
{
    uint64_t order_id = itch_uatoi(m->OrderReferenceNumber, sizeof(m->OrderReferenceNumber));
    auto it = order_id_map.find(order_id);
    if (it != order_id_map.end()) {
        uint64_t quantity = itch_uatoi(m->ExecutedQuantity, sizeof(m->ExecutedQuantity));
        uint64_t price = itch_uatoi(m->TradePrice, sizeof(m->TradePrice));
        auto& ob = it->second;
        auto result = ob.execute(order_id, quantity);
        ob.set_timestamp(timestamp());
        trade t{timestamp(), price, quantity, itch_trade_sign(result.side)};
        _process_event(make_event(ob.symbol(), timestamp(), &ob, &t, sweep_event(result)));
    }
}